

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

cmNinjaRule *
anon_unknown.dwarf_ff1b04::GetScanRule
          (cmNinjaRule *__return_storage_ptr__,string *ruleName,string *ppFileName,string *deptype,
          RuleVariables *vars,string *responseFlag,string *flags,
          cmRulePlaceholderExpander *rulePlaceholderExpander,cmLocalNinjaGenerator *generator,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *scanCmds,string *outputConfig)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string *psVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  cmOutputConverter *outputConverter;
  string *scanCmd;
  string *s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  RuleVariables scanVars;
  long *local_2d0;
  undefined8 local_2c8;
  long local_2c0 [2];
  string local_2b0;
  string local_280;
  string local_260;
  string local_240;
  undefined8 local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  size_t local_210;
  char *local_208;
  undefined8 local_200;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  long *local_1e8;
  undefined8 local_1e0;
  char *local_1d8;
  char local_1d0 [32];
  RuleVariables local_1b0;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  pcVar2 = (ruleName->_M_dataplus)._M_p;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,pcVar2,pcVar2 + ruleName->_M_string_length);
  cmNinjaRule::cmNinjaRule(__return_storage_ptr__,&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (deptype->_M_string_length == 4) {
    iVar5 = bcmp((deptype->_M_dataplus)._M_p,"msvc",4);
    if (iVar5 == 0) {
      std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->DepType);
      pcVar6 = "";
      goto LAB_003168d2;
    }
  }
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->DepType,0,
             (char *)(__return_storage_ptr__->DepType)._M_string_length,0x71dc05);
  pcVar6 = "$DEP_FILE";
LAB_003168d2:
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->DepFile,0,
             (char *)(__return_storage_ptr__->DepFile)._M_string_length,(ulong)pcVar6);
  memset(&local_1b0,0,0x150);
  local_1b0.CMTargetName = vars->CMTargetName;
  local_1b0.CMTargetType = vars->CMTargetType;
  local_1b0.Language = vars->Language;
  local_1b0.Object = "$OBJ_FILE";
  local_1b0.PreprocessedSource = (ppFileName->_M_dataplus)._M_p;
  local_1b0.DynDepFile = "$DYNDEP_INTERMEDIATE_FILE";
  local_1b0.DependencyFile = (__return_storage_ptr__->DepFile)._M_dataplus._M_p;
  local_1b0.DependencyTarget = "$out";
  local_1b0.Source = vars->Source;
  local_1b0.Defines = vars->Defines;
  local_1b0.Includes = vars->Includes;
  local_2d0 = local_2c0;
  pcVar2 = (flags->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,pcVar2,pcVar2 + flags->_M_string_length);
  if (responseFlag->_M_string_length != 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&__return_storage_ptr__->RspFile,0,
               (char *)(__return_storage_ptr__->RspFile)._M_string_length,0x6d6a96);
    pcVar6 = local_1b0.Defines;
    local_1e0 = 1;
    local_1d0[0] = ' ';
    local_1d8 = local_1d0;
    local_240.field_2._M_allocated_capacity = strlen(local_1b0.Defines);
    pcVar4 = local_1b0.Includes;
    local_240._M_dataplus._M_p = &DAT_00000001;
    local_240.field_2._8_8_ = pcVar6;
    paVar1 = &local_2b0.field_2;
    local_2b0._M_dataplus._M_p = &DAT_00000001;
    local_2b0.field_2._M_local_buf[0] = ' ';
    local_220 = 1;
    local_2b0._M_string_length = (size_type)paVar1;
    local_240._M_string_length = (size_type)local_1d0;
    local_218 = paVar1;
    local_210 = strlen(local_1b0.Includes);
    local_208 = pcVar4;
    local_1f8 = local_50;
    local_60 = 1;
    local_50[0] = 0x20;
    local_200 = 1;
    local_1f0 = local_2c8;
    local_1e8 = local_2d0;
    views._M_len = 6;
    views._M_array = (iterator)&local_240;
    local_58 = local_1f8;
    cmCatViews_abi_cxx11_(&local_280,views);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->RspContent,(string *)&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    local_240._M_string_length = (size_type)(responseFlag->_M_dataplus)._M_p;
    local_240._M_dataplus._M_p = (pointer)responseFlag->_M_string_length;
    local_240.field_2._8_8_ = (__return_storage_ptr__->RspFile)._M_dataplus._M_p;
    local_240.field_2._M_allocated_capacity = (__return_storage_ptr__->RspFile)._M_string_length;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_240;
    cmCatViews_abi_cxx11_(&local_2b0,views_00);
    std::__cxx11::string::operator=((string *)&local_2d0,(string *)&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p,
                      CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                               local_2b0.field_2._M_local_buf[0]) + 1);
    }
    local_1b0.Defines = "";
    local_1b0.Includes = "";
  }
  local_1b0.Flags = (char *)local_2d0;
  s = (scanCmds->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (scanCmds->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (s != psVar3) {
    outputConverter =
         &(generator->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
    if (generator == (cmLocalNinjaGenerator *)0x0) {
      outputConverter = (cmOutputConverter *)0x0;
    }
    do {
      cmRulePlaceholderExpander::ExpandRuleVariables
                (rulePlaceholderExpander,outputConverter,s,&local_1b0);
      s = s + 1;
    } while (s != psVar3);
  }
  local_2b0._M_string_length = 0;
  local_2b0.field_2._M_local_buf[0] = '\0';
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_240,generator,scanCmds,outputConfig,outputConfig,&local_2b0,
             (cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Command,(string *)&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,
                    CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                             local_2b0.field_2._M_local_buf[0]) + 1);
  }
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0,local_2c0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmNinjaRule GetScanRule(
  std::string const& ruleName, std::string const& ppFileName,
  std::string const& deptype,
  cmRulePlaceholderExpander::RuleVariables const& vars,
  const std::string& responseFlag, const std::string& flags,
  cmRulePlaceholderExpander* const rulePlaceholderExpander,
  cmLocalNinjaGenerator* generator, std::vector<std::string> scanCmds,
  const std::string& outputConfig)
{
  cmNinjaRule rule(ruleName);
  // Scanning always uses a depfile for preprocessor dependencies.
  if (deptype == "msvc"_s) {
    rule.DepType = deptype;
    rule.DepFile = "";
  } else {
    rule.DepType = ""; // no deps= for multiple outputs
    rule.DepFile = "$DEP_FILE";
  }

  cmRulePlaceholderExpander::RuleVariables scanVars;
  scanVars.CMTargetName = vars.CMTargetName;
  scanVars.CMTargetType = vars.CMTargetType;
  scanVars.Language = vars.Language;
  scanVars.Object = "$OBJ_FILE";
  scanVars.PreprocessedSource = ppFileName.c_str();
  scanVars.DynDepFile = "$DYNDEP_INTERMEDIATE_FILE";
  scanVars.DependencyFile = rule.DepFile.c_str();
  scanVars.DependencyTarget = "$out";

  // Scanning needs the same preprocessor settings as direct compilation would.
  scanVars.Source = vars.Source;
  scanVars.Defines = vars.Defines;
  scanVars.Includes = vars.Includes;

  // Scanning needs the compilation flags too.
  std::string scanFlags = flags;

  // If using a response file, move defines, includes, and flags into it.
  if (!responseFlag.empty()) {
    rule.RspFile = "$RSP_FILE";
    rule.RspContent =
      cmStrCat(' ', scanVars.Defines, ' ', scanVars.Includes, ' ', scanFlags);
    scanFlags = cmStrCat(responseFlag, rule.RspFile);
    scanVars.Defines = "";
    scanVars.Includes = "";
  }

  scanVars.Flags = scanFlags.c_str();

  // Rule for scanning a source file.
  for (std::string& scanCmd : scanCmds) {
    rulePlaceholderExpander->ExpandRuleVariables(generator, scanCmd, scanVars);
  }
  rule.Command =
    generator->BuildCommandLine(scanCmds, outputConfig, outputConfig);

  return rule;
}